

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test<float>(char *name)

{
  _ComplexT _Var1;
  int iVar2;
  size_t i;
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double local_60;
  double local_48;
  double dStack_40;
  
  if (test<float>(char_const*)::dft == '\0') {
    iVar2 = __cxa_guard_acquire(&test<float>(char_const*)::dft);
    if (iVar2 != 0) {
      SlidingDFT<float,_64UL>::SlidingDFT(&test<float>::dft);
      __cxa_guard_release(&test<float>(char_const*)::dft);
    }
  }
  puVar5 = &DAT_000fb6f0;
  lVar4 = 0x102af0;
  local_60 = 0.0;
  lVar7 = 0;
  for (lVar3 = 0; lVar3 != 0x79; lVar3 = lVar3 + 1) {
    SlidingDFT<float,_64UL>::update(&test<float>::dft,(float)(double)test1_time_domain_data[lVar3]);
    if (test<float>::dft.data_valid == true) {
      for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
        _Var1 = test<float>::dft.dft[lVar6]._M_value;
        local_48 = (double)(float)_Var1 - *(double *)(puVar5 + lVar6 * 8);
        dStack_40 = (double)(float)(_Var1 >> 0x20) - *(double *)(lVar4 + lVar6 * 8);
        dVar8 = std::abs<double>((complex<double> *)&local_48);
        local_60 = local_60 + dVar8;
      }
      lVar7 = lVar7 + 0x40;
    }
    puVar5 = puVar5 + 0x200;
    lVar4 = lVar4 + 0x200;
  }
  auVar9._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar9._0_8_ = lVar7;
  auVar9._12_4_ = 0x45300000;
  printf("%s: compared %zu complex numbers with an average error of %e\n",
         local_60 /
         ((auVar9._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)),name,lVar7);
  return;
}

Assistant:

void test(const char *name)
{
	static SlidingDFT<T, test1_FFT_LENGTH> dft;
	double error_sum = 0;
	size_t num_comparisons = 0;

	for (size_t i = 0; i < test1_TIME_LENGTH; i++) {
		dft.update((T)test1_time_domain[i]);
		if (dft.is_data_valid()) {
			for (size_t j = 0; j < test1_FFT_LENGTH; j++) {
				complex<double> calculated = dft.dft[j];
				complex<double> exact(test1_dft_real[i - test1_FFT_LENGTH + 1][j], test1_dft_imag[i - test1_FFT_LENGTH + 1][j]);
				double error = abs(calculated - exact);
				/*printf("[%2i,%2i] Calculated (%10.3e,%10.3e); expected (%10.3e,%10.3e), error=%11.6e\n", i, j,
					   calculated.real(), calculated.imag(),
					   exact.real(), exact.imag(),
					   error);*/
				error_sum += error;
				num_comparisons++;
			}
		}
	}
	double mean_error = error_sum / num_comparisons;
	printf("%s: compared %zu complex numbers with an average error of %e\n", name, num_comparisons, mean_error);
}